

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

AttConfig * __thiscall QPDFJob::AttConfig::mimetype(AttConfig *this,string *parameter)

{
  long lVar1;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *parameter_local;
  AttConfig *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  lVar1 = std::__cxx11::string::find((char)parameter,0x2f);
  if (lVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"mime type should be specified as type/subtype",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  std::__cxx11::string::operator=((string *)&(this->att).mimetype,(string *)local_18);
  return this;
}

Assistant:

QPDFJob::AttConfig*
QPDFJob::AttConfig::mimetype(std::string const& parameter)
{
    if (parameter.find('/') == std::string::npos) {
        usage("mime type should be specified as type/subtype");
    }
    this->att.mimetype = parameter;
    return this;
}